

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void __thiscall Search::predictor::~predictor(predictor *this)

{
  uint *puVar1;
  float *__ptr;
  char *__ptr_00;
  
  if (this->oracle_is_pointer == false) {
    puVar1 = (this->oracle_actions)._begin;
    if (puVar1 != (uint *)0x0) {
      free(puVar1);
    }
    (this->oracle_actions)._begin = (uint *)0x0;
    (this->oracle_actions)._end = (uint *)0x0;
    (this->oracle_actions).end_array = (uint *)0x0;
  }
  if (this->allowed_is_pointer == false) {
    puVar1 = (this->allowed_actions)._begin;
    if (puVar1 != (uint *)0x0) {
      free(puVar1);
    }
    (this->allowed_actions)._begin = (uint *)0x0;
    (this->allowed_actions)._end = (uint *)0x0;
    (this->allowed_actions).end_array = (uint *)0x0;
  }
  if (this->allowed_cost_is_pointer == false) {
    __ptr = (this->allowed_actions_cost)._begin;
    if (__ptr != (float *)0x0) {
      free(__ptr);
    }
    (this->allowed_actions_cost)._begin = (float *)0x0;
    (this->allowed_actions_cost)._end = (float *)0x0;
    (this->allowed_actions_cost).end_array = (float *)0x0;
  }
  free_ec(this);
  puVar1 = (this->condition_on_tags)._begin;
  if (puVar1 != (uint *)0x0) {
    free(puVar1);
  }
  (this->condition_on_tags)._begin = (uint *)0x0;
  (this->condition_on_tags)._end = (uint *)0x0;
  (this->condition_on_tags).end_array = (uint *)0x0;
  __ptr_00 = (this->condition_on_names)._begin;
  if (__ptr_00 != (char *)0x0) {
    free(__ptr_00);
  }
  (this->condition_on_names)._begin = (char *)0x0;
  (this->condition_on_names)._end = (char *)0x0;
  (this->condition_on_names).end_array = (char *)0x0;
  return;
}

Assistant:

predictor::~predictor()
{
  if (!oracle_is_pointer)
    oracle_actions.delete_v();
  if (!allowed_is_pointer)
    allowed_actions.delete_v();
  if (!allowed_cost_is_pointer)
    allowed_actions_cost.delete_v();
  free_ec();
  condition_on_tags.delete_v();
  condition_on_names.delete_v();
}